

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitImportedGlobal(PrintSExpression *this,Global *curr)

{
  ostream *poVar1;
  Global *curr_local;
  PrintSExpression *this_local;
  
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  emitImportHeader(this,&curr->super_Importable);
  std::operator<<(this->o,"(global ");
  poVar1 = wasm::Name::print((Name *)curr,this->o);
  std::operator<<(poVar1,' ');
  emitGlobalType(this,curr);
  poVar1 = std::operator<<(this->o,"))");
  std::operator<<(poVar1,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitImportedGlobal(Global* curr) {
  doIndent(o, indent);
  o << '(';
  emitImportHeader(curr);
  o << "(global ";
  curr->name.print(o) << ' ';
  emitGlobalType(curr);
  o << "))" << maybeNewLine;
}